

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

int Gia_RsbRemovalCost(Gia_RsbMan_t *p,int Index)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint i;
  int iVar4;
  int iVar5;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  int local_44;
  int nLeaves;
  int Cost;
  int m2;
  int m;
  Vec_Int_t *vTemp [2] [2];
  int Index_local;
  Gia_RsbMan_t *p_local;
  
  local_44 = 0;
  iVar1 = Vec_IntSize(p->vObjs);
  iVar2 = Vec_WecSize(p->vSets[0]);
  iVar3 = Vec_IntSize(p->vObjs);
  if (iVar2 != 1 << ((byte)iVar3 & 0x1f)) {
    __assert_fail("Vec_WecSize(p->vSets[0]) == (1 << Vec_IntSize(p->vObjs))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x5f5,"int Gia_RsbRemovalCost(Gia_RsbMan_t *, int)");
  }
  iVar2 = Vec_WecSize(p->vSets[1]);
  iVar3 = Vec_IntSize(p->vObjs);
  if (iVar2 != 1 << ((byte)iVar3 & 0x1f)) {
    __assert_fail("Vec_WecSize(p->vSets[1]) == (1 << Vec_IntSize(p->vObjs))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x5f6,"int Gia_RsbRemovalCost(Gia_RsbMan_t *, int)");
  }
  for (Cost = 0; Cost < 1 << ((byte)iVar1 & 0x1f); Cost = Cost + 1) {
    if ((Cost & 1 << ((byte)Index & 0x1f)) == 0) {
      i = Cost ^ 1 << ((byte)Index & 0x1f);
      p_00 = Vec_WecEntry(p->vSets[0],Cost);
      p_01 = Vec_WecEntry(p->vSets[1],Cost);
      p_02 = Vec_WecEntry(p->vSets[0],i);
      p_03 = Vec_WecEntry(p->vSets[1],i);
      iVar2 = Vec_IntSize(p_00);
      iVar3 = Vec_IntSize(p_02);
      iVar4 = Vec_IntSize(p_01);
      iVar5 = Vec_IntSize(p_03);
      local_44 = (iVar2 + iVar3) * (iVar4 + iVar5) + local_44;
    }
  }
  return local_44;
}

Assistant:

int Gia_RsbRemovalCost( Gia_RsbMan_t * p, int Index )
{
    Vec_Int_t * vTemp[2][2];
    //unsigned Mask = Abc_InfoMask( Index );
    int m, m2, Cost = 0, nLeaves = 1 << Vec_IntSize(p->vObjs);
    assert( Vec_WecSize(p->vSets[0]) == (1 << Vec_IntSize(p->vObjs)) );
    assert( Vec_WecSize(p->vSets[1]) == (1 << Vec_IntSize(p->vObjs)) );
    for ( m = 0; m < nLeaves; m++ )
    {
        if ( m & (1 << Index) )
            continue;
        m2 = m ^ (1 << Index);
        vTemp[0][0] = Vec_WecEntry(p->vSets[0], m);
        vTemp[0][1] = Vec_WecEntry(p->vSets[1], m);
        vTemp[1][0] = Vec_WecEntry(p->vSets[0], m2);
        vTemp[1][1] = Vec_WecEntry(p->vSets[1], m2);
        Cost += (Vec_IntSize(vTemp[0][0]) + Vec_IntSize(vTemp[1][0])) * (Vec_IntSize(vTemp[0][1]) + Vec_IntSize(vTemp[1][1]));
    }
    return Cost;
}